

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O1

string * __thiscall
spvtools::opt::Operand::AsString_abi_cxx11_(string *__return_storage_ptr__,Operand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint **ppuVar3;
  pointer pcVar4;
  bool bVar5;
  uint **ppuVar6;
  uint *puVar7;
  uint *puVar8;
  byte bVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  
  if (this->type != SPV_OPERAND_TYPE_LITERAL_STRING) {
    __assert_fail("type == SPV_OPERAND_TYPE_LITERAL_STRING",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                  ,0x67,"std::string spvtools::opt::Operand::AsString() const");
  }
  ppuVar3 = (uint **)(this->words).large_data_._M_t.
                     super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                     ._M_head_impl;
  ppuVar6 = &(this->words).small_data_;
  if (ppuVar3 != (uint **)0x0) {
    ppuVar6 = ppuVar3;
  }
  puVar7 = *ppuVar6;
  if (ppuVar3 == (uint **)0x0) {
    puVar8 = (this->words).small_data_ + (this->words).size_;
  }
  else {
    puVar8 = *(uint **)&((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)(ppuVar3 + 1))
                        ->_M_impl;
  }
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar12 = puVar7 == puVar8;
  if (bVar12) {
    bVar5 = false;
  }
  else {
    bVar5 = false;
    do {
      uVar2 = *puVar7;
      bVar9 = 0;
      bVar11 = false;
      uVar10 = 0;
      do {
        if ((char)(uVar2 >> (bVar9 & 0x1f)) == '\0') {
          bVar5 = true;
          break;
        }
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        bVar11 = 2 < uVar10;
        uVar10 = uVar10 + 1;
        bVar9 = bVar9 + 8;
      } while (uVar10 != 4);
      if (!bVar11) break;
      puVar7 = puVar7 + 1;
      bVar12 = puVar7 == puVar8;
    } while (!bVar12);
  }
  if (!bVar12) {
    if ((!bVar5) &&
       (pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pcVar4 != paVar1)) {
      operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("!assert_found_terminating_null && \"Did not find terminating null for the string.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/string_utils.h"
                ,0x65,
                "std::string spvtools::utils::MakeString(InputIt, InputIt, bool) [InputIt = const unsigned int *]"
               );
}

Assistant:

std::string AsString() const {
    assert(type == SPV_OPERAND_TYPE_LITERAL_STRING);
    return spvtools::utils::MakeString(words);
  }